

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O3

OCSPRevocationStatus
bssl::anon_unknown_20::CheckOCSP
          (string_view raw_response,string_view certificate_der,ParsedCertificate *certificate,
          string_view issuer_certificate_der,ParsedCertificate *issuer_certificate,
          int64_t verify_time_epoch_seconds,optional<long> max_age_seconds,
          ResponseStatus *response_details)

{
  optional<long> max_age_seconds_00;
  Input extensions_tlv;
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  OCSPRevocationStatus OVar3;
  _Rb_tree_node_base *p_Var4;
  ResponseStatus RVar5;
  OCSPResponseData *out;
  OCSPRevocationStatus OVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string_view der;
  string_view der_00;
  Input raw_tlv;
  Input raw_tlv_00;
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
  local_120;
  OCSPResponseData response_data;
  OCSPResponse response;
  
  out = (OCSPResponseData *)certificate_der._M_str;
  *response_details = NOT_CHECKED;
  if ((uchar *)raw_response._M_len == (uchar *)0x0) {
    *response_details = MISSING;
    return MAX_VALUE;
  }
  response.data.data_.data_ = (uchar *)0x0;
  response.data.data_.size_ = 0;
  response.signature.bytes_.data_.data_ = (uchar *)0x0;
  response.signature.bytes_.data_.size_ = 0;
  response.signature.unused_bits_ = '\0';
  response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  raw_tlv.data_.size_ = (size_t)&response;
  raw_tlv.data_.data_ = (uchar *)raw_response._M_len;
  bVar2 = ParseOCSPResponse((bssl *)raw_response._M_str,raw_tlv,(OCSPResponse *)out);
  if (bVar2) {
    if (response.status == SUCCESSFUL) {
      response_data.responder_id.key_hash.data_.data_ = (uchar *)0x0;
      response_data.responder_id.key_hash.data_.size_ = 0;
      response_data.responder_id.name.data_.data_ = (uchar *)0x0;
      response_data.responder_id.name.data_.size_ = 0;
      response_data.responses.
      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      response_data.responses.
      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      response_data.responses.
      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      response_data.extensions.data_.data_ = (uchar *)0x0;
      response_data.extensions.data_.size_ = 0;
      raw_tlv_00.data_.size_ = (size_t)&response_data;
      raw_tlv_00.data_.data_ = (uchar *)response.data.data_.size_;
      bVar2 = ParseOCSPResponseData((bssl *)response.data.data_.data_,raw_tlv_00,out);
      if (bVar2) {
        if (response_data.has_extensions == true) {
          extensions_tlv.data_.size_ = response_data.extensions.data_.size_;
          extensions_tlv.data_.data_ = response_data.extensions.data_.data_;
          p_Var1 = (_Rb_tree_node_base *)((long)&local_120 + 8);
          local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_120._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
          local_120._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
          bVar2 = ParseExtensions(extensions_tlv,
                                  (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                   *)&local_120);
          RVar5 = PARSE_RESPONSE_DATA_ERROR;
          p_Var4 = local_120._M_impl.super__Rb_tree_header._M_header._M_left;
          if (!bVar2) {
LAB_004a4524:
            *response_details = RVar5;
            ::std::
            _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
            ::~_Rb_tree(&local_120);
            goto LAB_004a4531;
          }
          for (; p_Var4 != p_Var1; p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4))
          {
            if (*(char *)&p_Var4[2]._M_left != '\0') {
              RVar5 = RESPONSE_STATUS_MAX;
              goto LAB_004a4524;
            }
          }
          ::std::
          _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
          ::~_Rb_tree(&local_120);
        }
        if (certificate == (ParsedCertificate *)0x0) {
          der._M_str = (char *)certificate_der._M_len;
          der._M_len = (size_t)&local_120;
          OCSPParseCertificate(der);
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_120._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_120._M_impl.super__Rb_tree_header._M_header._M_color);
          certificate = (ParsedCertificate *)local_120._M_impl._0_8_;
        }
        else {
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (issuer_certificate_der._M_str == (char *)0x0) {
          der_00._M_str = (char *)issuer_certificate;
          der_00._M_len = (size_t)&local_120;
          OCSPParseCertificate(der_00);
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(local_120._M_impl.super__Rb_tree_header._M_header._4_4_,
                             local_120._M_impl.super__Rb_tree_header._M_header._M_color);
          issuer_certificate_der._M_str = (char *)local_120._M_impl._0_8_;
        }
        else {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (certificate == (ParsedCertificate *)0x0 ||
            (ParsedCertificate *)issuer_certificate_der._M_str == (ParsedCertificate *)0x0) {
          *response_details = NOT_CHECKED;
LAB_004a44a6:
          OVar6 = MAX_VALUE;
        }
        else {
          bVar2 = bssl::der::operator<
                            (&response_data.produced_at,&(certificate->tbs_).validity_not_before);
          if ((bVar2) ||
             (bVar2 = bssl::der::operator>
                                (&response_data.produced_at,&(certificate->tbs_).validity_not_after)
             , bVar2)) {
            *response_details = BAD_PRODUCED_AT;
            goto LAB_004a44a6;
          }
          max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ =
               max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._M_value;
          max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = verify_time_epoch_seconds;
          OVar3 = GetRevocationStatusForCert
                            ((OCSPResponseData *)
                             response_data.responses.
                             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (ParsedCertificate *)
                             response_data.responses.
                             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                             ._M_impl.super__Vector_impl_data._M_finish,certificate,
                             (int64_t)issuer_certificate_der._M_str,max_age_seconds_00,
                             (ResponseStatus *)
                             (ulong)max_age_seconds.super__Optional_base<long,_true,_true>.
                                    _M_payload.super__Optional_payload_base<long>._M_engaged);
          bVar2 = VerifyOCSPResponseSignature
                            (&response,&response_data,
                             (ParsedCertificate *)issuer_certificate_der._M_str);
          OVar6 = MAX_VALUE;
          if (bVar2) {
            OVar6 = OVar3;
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
      }
      else {
        *response_details = PARSE_RESPONSE_DATA_ERROR;
LAB_004a4531:
        OVar6 = MAX_VALUE;
      }
      if (response_data.responses.
          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(response_data.responses.
                        super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)response_data.responses.
                              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)response_data.responses.
                              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_004a4318;
    }
    *response_details = ERROR_RESPONSE;
  }
  else {
    *response_details = PARSE_RESPONSE_ERROR;
  }
  OVar6 = MAX_VALUE;
LAB_004a4318:
  if (response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(response.certs.
                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)response.certs.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)response.certs.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return OVar6;
}

Assistant:

OCSPRevocationStatus CheckOCSP(
    std::string_view raw_response, std::string_view certificate_der,
    const ParsedCertificate *certificate,
    std::string_view issuer_certificate_der,
    const ParsedCertificate *issuer_certificate,
    int64_t verify_time_epoch_seconds, std::optional<int64_t> max_age_seconds,
    OCSPVerifyResult::ResponseStatus *response_details) {
  *response_details = OCSPVerifyResult::NOT_CHECKED;

  if (raw_response.empty()) {
    *response_details = OCSPVerifyResult::MISSING;
    return OCSPRevocationStatus::UNKNOWN;
  }

  OCSPResponse response;
  if (!ParseOCSPResponse(StringAsBytes(raw_response), &response)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // RFC 6960 defines all responses |response_status| != SUCCESSFUL as error
  // responses. No revocation information is provided on error responses, and
  // the OCSPResponseData structure is not set.
  if (response.status != OCSPResponse::ResponseStatus::SUCCESSFUL) {
    *response_details = OCSPVerifyResult::ERROR_RESPONSE;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Actual revocation information is contained within the BasicOCSPResponse as
  // a ResponseData structure. The BasicOCSPResponse was parsed above, and
  // contains an unparsed ResponseData. From RFC 6960:
  //
  // BasicOCSPResponse       ::= SEQUENCE {
  //    tbsResponseData      ResponseData,
  //    signatureAlgorithm   AlgorithmIdentifier,
  //    signature            BIT STRING,
  //    certs            [0] EXPLICIT SEQUENCE OF Certificate OPTIONAL }
  //
  // ResponseData ::= SEQUENCE {
  //     version              [0] EXPLICIT Version DEFAULT v1,
  //     responderID              ResponderID,
  //     producedAt               GeneralizedTime,
  //     responses                SEQUENCE OF SingleResponse,
  //     responseExtensions   [1] EXPLICIT Extensions OPTIONAL }
  OCSPResponseData response_data;
  if (!ParseOCSPResponseData(response.data, &response_data)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_DATA_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Process the OCSP ResponseData extensions. In particular, must reject if
  // there are any critical extensions that are not understood.
  if (response_data.has_extensions &&
      !ParseOCSPResponseDataExtensions(response_data.extensions,
                                       response_details)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  std::shared_ptr<const ParsedCertificate> parsed_certificate;
  std::shared_ptr<const ParsedCertificate> parsed_issuer_certificate;
  if (!certificate) {
    parsed_certificate = OCSPParseCertificate(certificate_der);
    certificate = parsed_certificate.get();
  }
  if (!issuer_certificate) {
    parsed_issuer_certificate = OCSPParseCertificate(issuer_certificate_der);
    issuer_certificate = parsed_issuer_certificate.get();
  }

  if (!certificate || !issuer_certificate) {
    *response_details = OCSPVerifyResult::NOT_CHECKED;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // If producedAt is outside of the certificate validity period, reject the
  // response.
  if (response_data.produced_at < certificate->tbs().validity_not_before ||
      response_data.produced_at > certificate->tbs().validity_not_after) {
    *response_details = OCSPVerifyResult::BAD_PRODUCED_AT;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Look through all of the OCSPSingleResponses for a match (based on CertID
  // and time).
  OCSPRevocationStatus status = GetRevocationStatusForCert(
      response_data, certificate, issuer_certificate, verify_time_epoch_seconds,
      max_age_seconds, response_details);

  // Check that the OCSP response has a valid signature. It must either be
  // signed directly by the issuing certificate, or a valid authorized
  // responder.
  if (!VerifyOCSPResponseSignature(response, response_data,
                                   issuer_certificate)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  return status;
}